

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  undefined4 in_ECX;
  TPZRegisterClassId *in_RDI;
  TPZVec<long> *in_R8;
  int i;
  TPZGeoEl *in_stack_000001d8;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *in_stack_000001e0;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int64_t in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZRegisterClassId *local_80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024538f0);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024535d8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024535d8;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoTetrahedra> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_R8);
  local_80 = in_RDI + 0x1510;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    local_80 = local_80 + 0x18;
  } while (local_80 != in_RDI + 0x1678);
  for (local_48 = 0; local_48 < 0xf; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_48 * 0x18 + 0x1510),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x16f7aa8);
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::Initialize(in_stack_000001e0,in_stack_000001d8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}